

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall
EqualArea_RemapEdges_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Point2f a,Point2f b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  char *message;
  Point2f p;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  float fVar6;
  undefined8 in_XMM1_Qb;
  undefined1 auVar7 [16];
  Vector3f VVar8;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  float local_3c;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Tuple2<pbrt::Point2,_float> local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 auVar5 [56];
  
  fVar6 = b.super_Tuple2<pbrt::Point2,_float>.y;
  local_28 = b.super_Tuple2<pbrt::Point2,_float>;
  VVar8 = pbrt::EqualAreaSquareToSphere(a);
  local_3c = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  local_18 = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uStack_10 = in_XMM0_Qb;
  p = pbrt::WrapEqualAreaSquare(local_28);
  auVar5 = extraout_var;
  VVar8 = pbrt::EqualAreaSquareToSphere(p);
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  auVar2._8_8_ = uStack_10;
  auVar2._0_8_ = local_18;
  auVar7._0_4_ = (float)local_18 * VVar8.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar7._4_4_ = (float)((ulong)local_18 >> 0x20) * VVar8.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar7._8_4_ = (float)uStack_10 * auVar5._0_4_;
  auVar7._12_4_ = (float)((ulong)uStack_10 >> 0x20) * auVar5._4_4_;
  auVar7 = vmovshdup_avx(auVar7);
  auVar7 = vfmadd231ss_fma(auVar7,auVar2,auVar4._0_16_);
  auVar1._4_4_ = fVar6;
  auVar1._0_4_ = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar7 = vfmadd231ss_fma(auVar7,auVar1,ZEXT416((uint)local_3c));
  local_48.data_._0_4_ = auVar7._0_4_;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fefae147ae147ae;
  testing::internal::CmpHelperGT<float,double>
            (local_38,"Dot(av, bv)",".99",(float *)&local_48,(double *)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(EqualArea, RemapEdges) {
    auto checkClose = [&](Point2f a, Point2f b) {
        Vector3f av = EqualAreaSquareToSphere(a);
        b = WrapEqualAreaSquare(b);
        Vector3f bv = EqualAreaSquareToSphere(b);
        EXPECT_GT(Dot(av, bv), .99);
    };

    checkClose(Point2f(.25, .01), Point2f(.25, -.01));
    checkClose(Point2f(.89, .01), Point2f(.89, -.01));

    checkClose(Point2f(.25, .99), Point2f(.25, 1.01));
    checkClose(Point2f(.89, .99), Point2f(.89, 1.01));

    checkClose(Point2f(.01, .66), Point2f(-.01, .66));
    checkClose(Point2f(.01, .15), Point2f(-.01, .15));

    checkClose(Point2f(.99, .66), Point2f(1.01, .66));
    checkClose(Point2f(.99, .15), Point2f(1.01, .15));

    checkClose(Point2f(.01, .01), Point2f(-.01, -.01));
    checkClose(Point2f(.99, .01), Point2f(1.01, -.01));
    checkClose(Point2f(.01, .99), Point2f(-.01, 1.01));
    checkClose(Point2f(.99, .99), Point2f(1.01, 1.01));
}